

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

bool __thiscall
cmGhsMultiTargetGenerator::VisitCustomCommand
          (cmGhsMultiTargetGenerator *this,
          set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
          *temp,set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                *perm,vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *order,
          cmSourceFile *si)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  iterator __position;
  bool bVar3;
  cmCustomCommand *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  cmLocalGenerator *pcVar5;
  cmSourceFile *si_00;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *di;
  pointer name;
  bool bVar8;
  pair<std::_Rb_tree_iterator<const_cmSourceFile_*>,_bool> pVar9;
  cmSourceFile *local_40;
  vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>> *local_38;
  
  p_Var1 = &(perm->_M_t)._M_impl.super__Rb_tree_header;
  p_Var7 = (perm->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[*(cmSourceFile **)(p_Var7 + 1) < si])
  {
    if (*(cmSourceFile **)(p_Var7 + 1) >= si) {
      p_Var6 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var7 = p_Var6, si < *(cmSourceFile **)(p_Var6 + 1))) {
    p_Var7 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    local_40 = si;
    pVar9 = std::
            _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
            ::_M_insert_unique<cmSourceFile_const*const&>
                      ((_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                        *)temp,&local_40);
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return true;
    }
    local_38 = (vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>> *)order;
    this_00 = cmSourceFile::GetCustomCommand(local_40);
    pvVar4 = cmCustomCommand::GetDepends_abi_cxx11_(this_00);
    pbVar2 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (name = (pvVar4->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; bVar8 = name != pbVar2, bVar8;
        name = name + 1) {
      pcVar5 = cmGeneratorTarget::GetLocalGenerator(this->GeneratorTarget);
      si_00 = cmMakefile::GetSourceFileWithOutput(pcVar5->Makefile,name);
      if ((si_00 != (cmSourceFile *)0x0) &&
         (bVar3 = VisitCustomCommand(this,temp,perm,
                                     (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                      *)local_38,si_00), bVar3)) {
        if (bVar8) {
          return true;
        }
        break;
      }
    }
    std::
    _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
    ::_M_insert_unique<cmSourceFile_const*const&>
              ((_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                *)perm,&local_40);
    __position._M_current = *(cmSourceFile ***)(local_38 + 8);
    if (__position._M_current == *(cmSourceFile ***)(local_38 + 0x10)) {
      std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>::
      _M_realloc_insert<cmSourceFile_const*const&>(local_38,__position,&local_40);
    }
    else {
      *__position._M_current = local_40;
      *(long *)(local_38 + 8) = *(long *)(local_38 + 8) + 8;
    }
  }
  return false;
}

Assistant:

bool cmGhsMultiTargetGenerator::VisitCustomCommand(
  std::set<cmSourceFile const*>& temp, std::set<cmSourceFile const*>& perm,
  std::vector<cmSourceFile const*>& order, cmSourceFile const* si)
{
  /* check if permanent mark is set*/
  if (perm.find(si) == perm.end()) {
    /* set temporary mark; check if revisit*/
    if (temp.insert(si).second) {
      for (auto& di : si->GetCustomCommand()->GetDepends()) {
        cmSourceFile const* sf = this->GeneratorTarget->GetLocalGenerator()
                                   ->GetMakefile()
                                   ->GetSourceFileWithOutput(di);
        /* if sf exists then visit */
        if (sf && this->VisitCustomCommand(temp, perm, order, sf)) {
          return true;
        }
      }
      /* mark as complete; insert into beginning of list*/
      perm.insert(si);
      order.push_back(si);
      return false;
    }
    /* revisiting item - not a DAG */
    return true;
  }
  /* already complete */
  return false;
}